

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ConditionalPathDeclarationSyntax::getChild
          (ConditionalPathDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  TokenOrSyntax *in_stack_ffffffffffffff90;
  nullptr_t in_stack_ffffffffffffff98;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff88);
    break;
  case 1:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token);
    break;
  case 2:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token_00);
    break;
  case 3:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x70));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 4:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token_01);
    break;
  case 5:
    not_null<slang::syntax::PathDeclarationSyntax_*>::get
              ((not_null<slang::syntax::PathDeclarationSyntax_*> *)(in_RSI + 0x88));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff98);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax ConditionalPathDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return openParen;
        case 3: return predicate.get();
        case 4: return closeParen;
        case 5: return path.get();
        default: return nullptr;
    }
}